

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall AActor::UnlinkFromWorld(AActor *this,FLinkContext *ctx)

{
  FBlockNode *pFVar1;
  uint uVar2;
  FBlockNode *next_1;
  FBlockNode *block;
  AActor *local_30;
  AActor *next;
  AActor **prev;
  FLinkContext *local_18;
  FLinkContext *ctx_local;
  AActor *this_local;
  
  if (ctx != (FLinkContext *)0x0) {
    ctx->sector_list = (msecnode_t *)0x0;
  }
  local_18 = ctx;
  ctx_local = (FLinkContext *)this;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&prev + 4),
             (int)this +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&prev + 4));
  if (uVar2 == 0) {
    next = (AActor *)this->sprev;
    local_30 = this->snext;
    if (next != (AActor *)0x0) {
      (next->super_DThinker).super_DObject._vptr_DObject = (_func_int **)local_30;
      if (local_30 != (AActor *)0x0) {
        local_30->sprev = (AActor **)next;
      }
      this->snext = (AActor *)0x0;
      this->sprev = (AActor **)0xbeefcafe;
      if (local_18 == (FLinkContext *)0x0) {
        P_DelSeclist(this->touching_sectorlist,0x1c0);
        P_DelSeclist(this->touching_rendersectors,0x1d0);
      }
      else {
        local_18->sector_list = this->touching_sectorlist;
        local_18->render_list = this->touching_rendersectors;
      }
      this->touching_sectorlist = (msecnode_t *)0x0;
      this->touching_rendersectors = (msecnode_t *)0x0;
    }
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&block + 4),
             (int)this +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&block + 4));
  if (uVar2 == 0) {
    next_1 = this->BlockNode;
    while (next_1 != (FBlockNode *)0x0) {
      if (next_1->NextActor != (FBlockNode *)0x0) {
        next_1->NextActor->PrevActor = next_1->PrevActor;
      }
      *next_1->PrevActor = next_1->NextActor;
      pFVar1 = next_1->NextBlock;
      FBlockNode::Release(next_1);
      next_1 = pFVar1;
    }
    this->BlockNode = (FBlockNode *)0x0;
  }
  return;
}

Assistant:

void AActor::UnlinkFromWorld (FLinkContext *ctx)
{
	if (ctx != nullptr) ctx->sector_list = nullptr;
	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't need to be in sector list
		// unlink from subsector

		// killough 8/11/98: simpler scheme using pointers-to-pointers for prev
		// pointers, allows head node pointers to be treated like everything else
		AActor **prev = sprev;
		AActor  *next = snext;

		if (prev != NULL)	// prev will be NULL if this actor gets deleted due to cleaning up from a broken savegame
		{
			if ((*prev = next))  // unlink from sector list
				next->sprev = prev;
			snext = NULL;
			sprev = (AActor **)(size_t)0xBeefCafe;	// Woo! Bug-catching value!

			// phares 3/14/98
			//
			// Save the sector list pointed to by touching_sectorlist.
			// In P_SetThingPosition, we'll keep any nodes that represent
			// sectors the Thing still touches. We'll add new ones then, and
			// delete any nodes for sectors the Thing has vacated. Then we'll
			// put it back into touching_sectorlist. It's done this way to
			// avoid a lot of deleting/creating for nodes, when most of the
			// time you just get back what you deleted anyway.

			if (ctx != nullptr)
			{
				ctx->sector_list = touching_sectorlist;
				ctx->render_list = touching_rendersectors;
			}
			else
			{
				P_DelSeclist(touching_sectorlist, &sector_t::touching_thinglist);
				P_DelSeclist(touching_rendersectors, &sector_t::touching_renderthings);
			}
			touching_sectorlist = nullptr; //to be restored by P_SetThingPosition
			touching_rendersectors = nullptr;
		}
	}
		
	if (!(flags & MF_NOBLOCKMAP))
	{
		// [RH] Unlink from all blocks this actor uses
		FBlockNode *block = this->BlockNode;

		while (block != NULL)
		{
			if (block->NextActor != NULL)
			{
				block->NextActor->PrevActor = block->PrevActor;
			}
			*(block->PrevActor) = block->NextActor;
			FBlockNode *next = block->NextBlock;
			block->Release ();
			block = next;
		}
		BlockNode = NULL;
	}
}